

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

bool __thiscall
ON_RevSurface::SetAngleRadians
          (ON_RevSurface *this,double start_angle_radians,double end_angle_radians)

{
  double dVar1;
  
  dVar1 = end_angle_radians - start_angle_radians;
  if (0.0 <= dVar1) {
    ON_Interval::Set(&this->m_angle,start_angle_radians,
                     (double)(-(ulong)(dVar1 <= 2.3283064365386963e-10) &
                              (ulong)(start_angle_radians + 6.283185307179586) |
                             ~-(ulong)(dVar1 <= 2.3283064365386963e-10) &
                             (~-(ulong)(6.283185307179586 < dVar1) & (ulong)end_angle_radians |
                             -(ulong)(6.283185307179586 < dVar1) &
                             (ulong)(start_angle_radians + 6.283185307179586))));
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  }
  return 0.0 <= dVar1;
}

Assistant:

bool ON_RevSurface::SetAngleRadians(
  double start_angle_radians,
  double end_angle_radians
  )
{
  bool rc = false;
  double d = end_angle_radians-start_angle_radians;
  if ( d >= 0.0 )
  {
    if ( d <= ON_ZERO_TOLERANCE || d > 2.0*ON_PI )
    {
      end_angle_radians = start_angle_radians + 2.0*ON_PI;
    }
    m_angle.Set( start_angle_radians, end_angle_radians );
    rc = true;
    DestroySurfaceTree();
  }
  return rc;
}